

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

void js_std_file_finalizer(JSRuntime *rt,JSValue val)

{
  FILE *__stream;
  undefined8 *ptr;
  
  ptr = (undefined8 *)JS_GetOpaque(val,js_std_file_class_id);
  if (ptr != (undefined8 *)0x0) {
    __stream = (FILE *)*ptr;
    if ((__stream != (FILE *)0x0) && (*(int *)(ptr + 1) != 0)) {
      if (*(int *)((long)ptr + 0xc) == 0) {
        fclose(__stream);
      }
      else {
        pclose(__stream);
      }
    }
    js_free_rt(rt,ptr);
    return;
  }
  return;
}

Assistant:

static void js_std_file_finalizer(JSRuntime *rt, JSValue val)
{
    JSSTDFile *s = JS_GetOpaque(val, js_std_file_class_id);
    if (s) {
        if (s->f && s->close_in_finalizer) {
            if (s->is_popen)
                pclose(s->f);
            else
                fclose(s->f);
        }
        js_free_rt(rt, s);
    }
}